

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O0

void __thiscall
KDReports::Cell::addElement(Cell *this,Element *element,AlignmentFlag horizontalAlignment)

{
  int iVar1;
  pointer this_00;
  undefined4 extraout_var;
  ElementData local_38;
  AlignmentFlag local_1c;
  Element *pEStack_18;
  AlignmentFlag horizontalAlignment_local;
  Element *element_local;
  Cell *this_local;
  
  local_1c = horizontalAlignment;
  pEStack_18 = element;
  element_local = &this->super_Element;
  this_00 = std::unique_ptr<KDReports::CellPrivate,_std::default_delete<KDReports::CellPrivate>_>::
            operator->(&this->d);
  iVar1 = (*pEStack_18->_vptr_Element[3])();
  ElementData::ElementData(&local_38,(Element *)CONCAT44(extraout_var,iVar1),local_1c);
  QList<KDReports::ElementData>::append(&this_00->m_elements,&local_38);
  ElementData::~ElementData(&local_38);
  return;
}

Assistant:

void KDReports::Cell::addElement(const Element &element, Qt::AlignmentFlag horizontalAlignment)
{
    d->m_elements.append(KDReports::ElementData(element.clone(), horizontalAlignment));
}